

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mutex.cpp
# Opt level: O0

void __thiscall Mutex::create_lock(Mutex *this)

{
  pthread_mutexattr_t local_18;
  uint local_14;
  pthread_mutexattr_t attr;
  int res;
  Mutex *this_local;
  
  local_14 = 0;
  _attr = this;
  pthread_mutexattr_init(&local_18);
  if ((this->mRecursive & 1U) == 0) {
    local_14 = pthread_mutexattr_settype(&local_18,2);
  }
  else {
    local_14 = pthread_mutexattr_settype(&local_18,1);
  }
  local_14 = pthread_mutex_init((pthread_mutex_t *)this,&local_18);
  if (local_14 != 0) {
    if (local_14 == 0xb) {
      jh_log_print(1,"void Mutex::create_lock()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Mutex.cpp"
                   ,0x97,"pthread_mutex_init() failed with EAGAIN");
    }
    else if (local_14 == 0x10) {
      jh_log_print(1,"void Mutex::create_lock()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Mutex.cpp"
                   ,0x99,"pthread_mutex_init() failed with EBUSY");
    }
    else if (local_14 == 0x16) {
      jh_log_print(1,"void Mutex::create_lock()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Mutex.cpp"
                   ,0x9b,"pthread_mutex_init() failed with EINVAL");
    }
    else {
      jh_log_print(1,"void Mutex::create_lock()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Mutex.cpp"
                   ,0x9d,"pthread_mutex_init() failed with %d",(ulong)local_14);
    }
  }
  local_14 = pthread_mutexattr_destroy(&local_18);
  if (local_14 != 0) {
    if (local_14 == 0x16) {
      jh_log_print(1,"void Mutex::create_lock()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Mutex.cpp"
                   ,0xa5,"pthread_mutexattr_destroy() failed with EINVAL");
    }
    else {
      jh_log_print(1,"void Mutex::create_lock()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Mutex.cpp"
                   ,0xa7,"pthread_mutexattr_destroy() failed with %d",(ulong)local_14);
    }
  }
  return;
}

Assistant:

void Mutex::create_lock()
{
	int res = 0;

	pthread_mutexattr_t attr;
	pthread_mutexattr_init( &attr );
	if ( mRecursive )
		res = pthread_mutexattr_settype( &attr, JH_PTHREAD_MUTEX_RECURSIVE );
	else
		res = pthread_mutexattr_settype( &attr, JH_PTHREAD_MUTEX_ERRORCHECK );
	
	// Initialize the mutex in the default state 
	res = pthread_mutex_init( &mMutex, &attr );

	if ( res )
	{
		if ( res == EAGAIN )
			LOG_ERR_FATAL("pthread_mutex_init() failed with EAGAIN");
		else if ( res == EBUSY )
			LOG_ERR_FATAL("pthread_mutex_init() failed with EBUSY");
		else if ( res == EINVAL )
			LOG_ERR_FATAL("pthread_mutex_init() failed with EINVAL");
		else
			LOG_ERR_FATAL("pthread_mutex_init() failed with %d", res);
	}

	res = pthread_mutexattr_destroy( &attr );

	if ( res )
	{
		if ( res == EINVAL )
			LOG_ERR_FATAL("pthread_mutexattr_destroy() failed with EINVAL");
		else
			LOG_ERR_FATAL("pthread_mutexattr_destroy() failed with %d", res);
	}
}